

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_settable(lua_State *L,int idx)

{
  long lVar1;
  TValue *t;
  TValue *slot;
  TValue *io1;
  
  t = index2value(L,idx);
  if (t->tt_ == 'E') {
    slot = luaH_get((Table *)(t->value_).gc,(TValue *)((L->top).offset + -0x20));
    if ((slot->tt_ & 0xf) != 0) {
      lVar1 = (L->top).offset;
      slot->value_ = *(Value *)(lVar1 + -0x10);
      slot->tt_ = *(lu_byte *)(lVar1 + -8);
      if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) &&
          ((((t->value_).gc)->marked & 0x20) != 0)) &&
         ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
        luaC_barrierback_(L,(t->value_).gc);
      }
      goto LAB_001054c7;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  luaV_finishset(L,t,(TValue *)((L->top).offset + -0x20),(TValue *)((L->top).offset + -0x10),slot);
LAB_001054c7:
  (L->top).p = (StkId)((L->top).offset + -0x20);
  return;
}

Assistant:

LUA_API void lua_settable (lua_State *L, int idx) {
  TValue *t;
  const TValue *slot;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2value(L, idx);
  if (luaV_fastget(L, t, s2v(L->top.p - 2), slot, luaH_get)) {
    luaV_finishfastset(L, t, slot, s2v(L->top.p - 1));
  }
  else
    luaV_finishset(L, t, s2v(L->top.p - 2), s2v(L->top.p - 1), slot);
  L->top.p -= 2;  /* pop index and value */
  lua_unlock(L);
}